

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hexdumper.h
# Opt level: O2

void Hex::Hexdumper<unsigned_long>::output_bin(ostream *os,remove_const_t<unsigned_long> val)

{
  undefined8 uVar1;
  char cVar2;
  char cVar3;
  int len;
  long lVar4;
  undefined8 uStack_130;
  char bits [257];
  
  lVar4 = 0;
  for (; val != 0; val = val >> 1) {
    bits[lVar4] = (byte)val & 1 | 0x30;
    lVar4 = lVar4 + 1;
  }
  bits[lVar4] = '\0';
  uVar1 = *(undefined8 *)(os + *(long *)(*(long *)os + -0x18) + 0x10);
  uStack_130 = 0x10a149;
  cVar2 = std::ios::fill();
  if ((int)lVar4 < (int)uVar1) {
    cVar3 = ' ';
    if (cVar2 != '\0') {
      cVar3 = cVar2;
    }
    *(long *)(os + *(long *)(*(long *)os + -0x18) + 0x10) = (long)((int)uVar1 - (int)lVar4);
    while( true ) {
      uStack_130 = 0x10a193;
      std::operator<<(os,cVar3);
LAB_0010a17d:
      if (lVar4 < 1) break;
      cVar3 = bits[lVar4 + -1];
      lVar4 = lVar4 + -1;
    }
    return;
  }
  *(undefined8 *)(os + *(long *)(*(long *)os + -0x18) + 0x10) = 0;
  goto LAB_0010a17d;
}

Assistant:

static void output_bin(std::ostream& os, std::remove_const_t<T> val)
    {
        char bits[257];
        int len = 0;
        while (val && len<256) {
            bits[len++] = (val&1) ? '1' : '0';
            val >>= 1;
        }
        bits[len] = 0;

        int width = os.width();
        char fill = os.fill();
        if (!fill) fill = ' ';
        if (width>len) {
            os << std::setw(width-len);
            os << fill;
        }
        else {
            os << std::setw(0);
        }

        for (int i=len-1 ; i>=0 ; i--)
            os << bits[i];
    }